

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

void __thiscall btCollisionWorldImporter::deleteAllData(btCollisionWorldImporter *this)

{
  btCollisionWorld *pbVar1;
  btCollisionShape *pbVar2;
  btOptimizedBvh *pbVar3;
  btTriangleInfoMap *pbVar4;
  btTriangleIndexVertexArray *pbVar5;
  char *pcVar6;
  btStridingMeshInterfaceData *pbVar7;
  btMeshPartData *pbVar8;
  void *pvVar9;
  btCollisionObject **ppbVar10;
  long lVar11;
  int a;
  long lVar12;
  long lVar13;
  
  for (lVar13 = 0; lVar13 < (this->m_allocatedCollisionObjects).m_size; lVar13 = lVar13 + 1) {
    pbVar1 = this->m_collisionWorld;
    ppbVar10 = (this->m_allocatedCollisionObjects).m_data;
    if (pbVar1 != (btCollisionWorld *)0x0) {
      (*pbVar1->_vptr_btCollisionWorld[10])(pbVar1,ppbVar10[lVar13]);
      ppbVar10 = (this->m_allocatedCollisionObjects).m_data;
    }
    if (ppbVar10[lVar13] != (btCollisionObject *)0x0) {
      (*ppbVar10[lVar13]->_vptr_btCollisionObject[1])();
    }
  }
  btAlignedObjectArray<btCollisionObject_*>::clear(&this->m_allocatedCollisionObjects);
  for (lVar13 = 0; lVar13 < (this->m_allocatedCollisionShapes).m_size; lVar13 = lVar13 + 1) {
    pbVar2 = (this->m_allocatedCollisionShapes).m_data[lVar13];
    if (pbVar2 != (btCollisionShape *)0x0) {
      (*pbVar2->_vptr_btCollisionShape[1])();
    }
  }
  btAlignedObjectArray<btCollisionShape_*>::clear(&this->m_allocatedCollisionShapes);
  for (lVar13 = 0; lVar13 < (this->m_allocatedBvhs).m_size; lVar13 = lVar13 + 1) {
    pbVar3 = (this->m_allocatedBvhs).m_data[lVar13];
    if (pbVar3 != (btOptimizedBvh *)0x0) {
      (*(pbVar3->super_btQuantizedBvh)._vptr_btQuantizedBvh[1])();
    }
  }
  btAlignedObjectArray<btOptimizedBvh_*>::clear(&this->m_allocatedBvhs);
  for (lVar13 = 0; lVar13 < (this->m_allocatedTriangleInfoMaps).m_size; lVar13 = lVar13 + 1) {
    pbVar4 = (this->m_allocatedTriangleInfoMaps).m_data[lVar13];
    if (pbVar4 != (btTriangleInfoMap *)0x0) {
      (*pbVar4->_vptr_btTriangleInfoMap[1])();
    }
  }
  btAlignedObjectArray<btTriangleInfoMap_*>::clear(&this->m_allocatedTriangleInfoMaps);
  for (lVar13 = 0; lVar13 < (this->m_allocatedTriangleIndexArrays).m_size; lVar13 = lVar13 + 1) {
    pbVar5 = (this->m_allocatedTriangleIndexArrays).m_data[lVar13];
    if (pbVar5 != (btTriangleIndexVertexArray *)0x0) {
      (*(pbVar5->super_btStridingMeshInterface)._vptr_btStridingMeshInterface[1])();
    }
  }
  btAlignedObjectArray<btTriangleIndexVertexArray_*>::clear(&this->m_allocatedTriangleIndexArrays);
  for (lVar13 = 0; lVar13 < (this->m_allocatedNames).m_size; lVar13 = lVar13 + 1) {
    pcVar6 = (this->m_allocatedNames).m_data[lVar13];
    if (pcVar6 != (char *)0x0) {
      operator_delete__(pcVar6);
    }
  }
  btAlignedObjectArray<char_*>::clear(&this->m_allocatedNames);
  for (lVar13 = 0; lVar13 < (this->m_allocatedbtStridingMeshInterfaceDatas).m_size;
      lVar13 = lVar13 + 1) {
    pbVar7 = (this->m_allocatedbtStridingMeshInterfaceDatas).m_data[lVar13];
    lVar11 = 0x28;
    for (lVar12 = 0; pbVar8 = pbVar7->m_meshPartsPtr, lVar12 < pbVar7->m_numMeshParts;
        lVar12 = lVar12 + 1) {
      pvVar9 = *(void **)((long)pbVar8 + lVar11 + -0x28);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      pvVar9 = *(void **)((long)pbVar8 + lVar11 + -0x20);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      pvVar9 = *(void **)((long)pbVar8 + lVar11 + -0x18);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      pvVar9 = *(void **)((long)pbVar8 + lVar11 + -0x10);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      pvVar9 = *(void **)((long)&pbVar8->m_vertices3f + lVar11);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      pvVar9 = *(void **)((long)pbVar8 + lVar11 + -8);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      lVar11 = lVar11 + 0x38;
    }
    if (pbVar8 != (btMeshPartData *)0x0) {
      operator_delete__(pbVar8);
    }
    ::operator_delete(pbVar7);
  }
  btAlignedObjectArray<btStridingMeshInterfaceData_*>::clear
            (&this->m_allocatedbtStridingMeshInterfaceDatas);
  for (lVar13 = 0; lVar13 < (this->m_indexArrays).m_size; lVar13 = lVar13 + 1) {
    btAlignedFreeInternal((this->m_indexArrays).m_data[lVar13]);
  }
  btAlignedObjectArray<int_*>::clear(&this->m_indexArrays);
  for (lVar13 = 0; lVar13 < (this->m_shortIndexArrays).m_size; lVar13 = lVar13 + 1) {
    btAlignedFreeInternal((this->m_shortIndexArrays).m_data[lVar13]);
  }
  btAlignedObjectArray<short_*>::clear(&this->m_shortIndexArrays);
  for (lVar13 = 0; lVar13 < (this->m_charIndexArrays).m_size; lVar13 = lVar13 + 1) {
    btAlignedFreeInternal((this->m_charIndexArrays).m_data[lVar13]);
  }
  btAlignedObjectArray<unsigned_char_*>::clear(&this->m_charIndexArrays);
  for (lVar13 = 0; lVar13 < (this->m_floatVertexArrays).m_size; lVar13 = lVar13 + 1) {
    btAlignedFreeInternal((this->m_floatVertexArrays).m_data[lVar13]);
  }
  btAlignedObjectArray<btVector3FloatData_*>::clear(&this->m_floatVertexArrays);
  for (lVar13 = 0; lVar13 < (this->m_doubleVertexArrays).m_size; lVar13 = lVar13 + 1) {
    btAlignedFreeInternal((this->m_doubleVertexArrays).m_data[lVar13]);
  }
  btAlignedObjectArray<btVector3DoubleData_*>::clear(&this->m_doubleVertexArrays);
  return;
}

Assistant:

void btCollisionWorldImporter::deleteAllData()
{
	int i;

	for (i=0;i<m_allocatedCollisionObjects.size();i++)
	{
		if(m_collisionWorld)
			m_collisionWorld->removeCollisionObject(m_allocatedCollisionObjects[i]);
		delete m_allocatedCollisionObjects[i];
	}

	m_allocatedCollisionObjects.clear();


	for (i=0;i<m_allocatedCollisionShapes.size();i++)
	{
		delete m_allocatedCollisionShapes[i];
	}
	m_allocatedCollisionShapes.clear();


	for (i=0;i<m_allocatedBvhs.size();i++)
	{
		delete m_allocatedBvhs[i];
	}
	m_allocatedBvhs.clear();

	for (i=0;i<m_allocatedTriangleInfoMaps.size();i++)
	{
		delete m_allocatedTriangleInfoMaps[i];
	}
	m_allocatedTriangleInfoMaps.clear();
	for (i=0;i<m_allocatedTriangleIndexArrays.size();i++)
	{
		delete m_allocatedTriangleIndexArrays[i];
	}
	m_allocatedTriangleIndexArrays.clear();
	for (i=0;i<m_allocatedNames.size();i++)
	{
		delete[] m_allocatedNames[i];
	}
	m_allocatedNames.clear();

	for (i=0;i<m_allocatedbtStridingMeshInterfaceDatas.size();i++)
	{
		btStridingMeshInterfaceData* curData = m_allocatedbtStridingMeshInterfaceDatas[i];

		for(int a = 0;a < curData->m_numMeshParts;a++)
		{
			btMeshPartData* curPart = &curData->m_meshPartsPtr[a];
			if(curPart->m_vertices3f)
				delete [] curPart->m_vertices3f;

			if(curPart->m_vertices3d)
				delete [] curPart->m_vertices3d;

			if(curPart->m_indices32)
				delete [] curPart->m_indices32;

			if(curPart->m_3indices16)
				delete [] curPart->m_3indices16;

			if(curPart->m_indices16)
				delete [] curPart->m_indices16;

			if (curPart->m_3indices8)
				delete [] curPart->m_3indices8;

		}
		delete [] curData->m_meshPartsPtr;
		delete curData;
	}
	m_allocatedbtStridingMeshInterfaceDatas.clear();

	for (i=0;i<m_indexArrays.size();i++)
	{
		btAlignedFree(m_indexArrays[i]);
	}
  m_indexArrays.clear();

	for (i=0;i<m_shortIndexArrays.size();i++)
	{
		btAlignedFree(m_shortIndexArrays[i]);
	}
  m_shortIndexArrays.clear();

	for (i=0;i<m_charIndexArrays.size();i++)
	{
		btAlignedFree(m_charIndexArrays[i]);
	}
  m_charIndexArrays.clear();

	for (i=0;i<m_floatVertexArrays.size();i++)
	{
		btAlignedFree(m_floatVertexArrays[i]);
	}
  m_floatVertexArrays.clear();

	for (i=0;i<m_doubleVertexArrays.size();i++)
	{
		btAlignedFree(m_doubleVertexArrays[i]);
	}
   m_doubleVertexArrays.clear();


}